

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

unsigned_long ndiGetBXFrame(ndicapi *pol,int portHandle)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    while (pol->BxHandles[uVar2] != portHandle) {
      uVar2 = uVar2 + 1;
      if ((uint)bVar1 == uVar2) {
        return 0;
      }
    }
  }
  if ((uint)uVar2 == (uint)bVar1) {
    return 0;
  }
  return (ulong)pol->BxFrameNumber[uVar2 & 0xffffffff];
}

Assistant:

ndicapiExport unsigned long ndiGetBXFrame(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxFrameNumber[i];
}